

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

uint * __thiscall cimg_library::CImg<unsigned_int>::min(CImg<unsigned_int> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  bool bVar6;
  CImgInstanceException *this_00;
  char *pcVar7;
  char *pcVar8;
  ulongT uVar9;
  uint *_maxptrs;
  uint *ptrs;
  uint *puStack_28;
  uint min_value;
  uint *ptr_min;
  CImg<unsigned_int> *this_local;
  
  bVar6 = is_empty(this);
  if (!bVar6) {
    puStack_28 = this->_data;
    ptrs._4_4_ = *puStack_28;
    _maxptrs = this->_data;
    puVar5 = this->_data;
    uVar9 = size(this);
    for (; _maxptrs < puVar5 + uVar9; _maxptrs = _maxptrs + 1) {
      if (*_maxptrs < ptrs._4_4_) {
        puStack_28 = _maxptrs;
        ptrs._4_4_ = *_maxptrs;
      }
    }
    return puStack_28;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  puVar5 = this->_data;
  pcVar7 = "non-";
  if ((this->_is_shared & 1U) != 0) {
    pcVar7 = "";
  }
  pcVar8 = pixel_type();
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::min(): Empty instance.",
             (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8);
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgInstanceException::~CImgInstanceException
             );
}

Assistant:

const T& min() const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_min = _data;
      T min_value = *ptr_min;
      cimg_for(*this,ptrs,T) if (*ptrs<min_value) min_value = *(ptr_min=ptrs);
      return *ptr_min;
    }